

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doListAttachments(QPDFJob *this,QPDF *pdf)

{
  bool bVar1;
  element_type *key_00;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *cstr;
  Pipeline *pPVar5;
  QPDFLogger local_158;
  anon_class_8_1_898b2338 local_148;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_140;
  allocator<char> local_119;
  string local_118 [32];
  undefined1 local_f8 [24];
  string local_e0;
  QPDFLogger local_c0;
  undefined1 local_b0 [8];
  shared_ptr<QPDFFileSpecObjectHelper> efoh;
  string *key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>
  *i;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
  *__range2;
  undefined1 local_38 [8];
  QPDFEmbeddedFileDocumentHelper efdh;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  efdh.m.super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)local_38,pdf);
  bVar1 = QPDFEmbeddedFileDocumentHelper::hasEmbeddedFiles
                    ((QPDFEmbeddedFileDocumentHelper *)local_38);
  if (bVar1) {
    QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
                *)&__begin2,(QPDFEmbeddedFileDocumentHelper *)local_38);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
                      *)&__begin2);
    i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
                  *)&__begin2);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&i);
      if (!bVar1) break;
      efoh.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>
              ::operator*(&__end2);
      std::shared_ptr<QPDFFileSpecObjectHelper>::shared_ptr
                ((shared_ptr<QPDFFileSpecObjectHelper> *)local_b0,
                 &((reference)
                  efoh.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->second);
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)peVar2);
      QPDFLogger::getInfo(&local_c0,SUB81(peVar3,0));
      peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &local_c0);
      pPVar5 = Pipeline::operator<<
                         (peVar4,(string *)
                                 efoh.
                                 super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
      pPVar5 = Pipeline::operator<<(pPVar5," -> ");
      key_00 = std::
               __shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_119);
      QPDFFileSpecObjectHelper::getEmbeddedFileStream
                ((QPDFFileSpecObjectHelper *)local_f8,(string *)key_00);
      local_f8._16_8_ = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_f8);
      QPDFObjGen::unparse_abi_cxx11_
                ((string *)(local_f8 + 0x18),(QPDFObjGen *)(local_f8 + 0x10),',');
      pPVar5 = Pipeline::operator<<(pPVar5,(string *)(local_f8 + 0x18));
      Pipeline::operator<<(pPVar5,"\n");
      std::__cxx11::string::~string((string *)(local_f8 + 0x18));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_f8);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator(&local_119);
      std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_c0);
      local_148.efoh = (shared_ptr<QPDFFileSpecObjectHelper> *)local_b0;
      std::function<void(Pipeline&,std::__cxx11::string_const&)>::
      function<QPDFJob::doListAttachments(QPDF&)::__0,void>
                ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_140,&local_148);
      doIfVerbose(this,&local_140);
      std::
      function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_140);
      std::shared_ptr<QPDFFileSpecObjectHelper>::~shared_ptr
                ((shared_ptr<QPDFFileSpecObjectHelper> *)local_b0);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>
      ::operator++(&__end2);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
            *)&__begin2);
  }
  else {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )peVar2);
    QPDFLogger::getInfo(&local_158,SUB81(peVar3,0));
    peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_158);
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    cstr = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(peVar2->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
    pPVar5 = Pipeline::operator<<(peVar4,cstr);
    Pipeline::operator<<(pPVar5," has no embedded files\n");
    std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_158);
  }
  QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)local_38);
  return;
}

Assistant:

void
QPDFJob::doListAttachments(QPDF& pdf)
{
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    if (efdh.hasEmbeddedFiles()) {
        for (auto const& i: efdh.getEmbeddedFiles()) {
            std::string const& key = i.first;
            auto efoh = i.second;
            *m->log->getInfo() << key << " -> "
                               << efoh->getEmbeddedFileStream().getObjGen().unparse(',') << "\n";
            doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                auto desc = efoh->getDescription();
                if (!desc.empty()) {
                    v << "  description: " << desc << "\n";
                }
                v << "  preferred name: " << efoh->getFilename() << "\n";
                v << "  all names:\n";
                for (auto const& i2: efoh->getFilenames()) {
                    v << "    " << i2.first << " -> " << i2.second << "\n";
                }
                v << "  all data streams:\n";
                for (auto const& [key2, value2]: efoh->getEmbeddedFileStreams().as_dictionary()) {
                    if (value2.null()) {
                        continue;
                    }
                    auto efs = QPDFEFStreamObjectHelper(value2);
                    v << "    " << key2 << " -> " << efs.getObjectHandle().getObjGen().unparse(',')
                      << "\n";
                    v << "      creation date: " << efs.getCreationDate() << "\n"
                      << "      modification date: " << efs.getModDate() << "\n"
                      << "      mime type: " << efs.getSubtype() << "\n"
                      << "      checksum: " << QUtil::hex_encode(efs.getChecksum()) << "\n";
                }
            });
        }
    } else {
        *m->log->getInfo() << m->infilename.get() << " has no embedded files\n";
    }
}